

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::PrintMarkCollectionStats(Recycler *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar23;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  size_t leafCount;
  size_t invalidCount;
  size_t nonMark;
  Recycler *this_local;
  undefined1 auVar14 [16];
  
  lVar6 = (((this->collectionStats).tryMarkCount + (this->collectionStats).tryMarkInteriorCount) -
          (this->collectionStats).remarkCount) - (this->collectionStats).markData.markCount;
  lVar7 = ((((lVar6 - (this->collectionStats).tryMarkNullCount) -
            (this->collectionStats).tryMarkUnalignedCount) -
           (this->collectionStats).tryMarkNonRecyclerMemoryCount) -
          (this->collectionStats).tryMarkInteriorNonRecyclerMemoryCount) -
          (this->collectionStats).tryMarkInteriorNullCount;
  lVar5 = (this->collectionStats).markData.markCount - (this->collectionStats).scanCount;
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"Try Mark    :%9s %5s %10s | Non-Mark  : %9s %5s | Mark    :%9s %5s \n",L"Count",
                L"%",L"Bytes",L"Count",L"%",L"Count",L"%");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  sVar2 = (this->collectionStats).tryMarkCount;
  sVar3 = (this->collectionStats).tryMarkNullCount;
  auVar8._8_4_ = (int)(sVar3 >> 0x20);
  auVar8._0_8_ = sVar3;
  auVar8._12_4_ = 0x45300000;
  uVar23 = (undefined4)((ulong)lVar6 >> 0x20);
  auVar14._8_4_ = uVar23;
  auVar14._0_8_ = lVar6;
  auVar14._12_4_ = 0x45300000;
  uVar13 = (undefined4)lVar6;
  sVar4 = (this->collectionStats).scanCount;
  auVar15._8_4_ = (int)(sVar4 >> 0x20);
  auVar15._0_8_ = sVar4;
  auVar15._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).markData.markCount;
  auVar28._8_4_ = (int)(sVar1 >> 0x20);
  auVar28._0_8_ = sVar1;
  auVar28._12_4_ = 0x45300000;
  Output::Print(L" TryMark    :%9d       %10d | Null      : %9d %5.1f | Scan    :%9d %5.1f\n",
                (((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) /
                ((auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0))) * 100.0,
                (((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) /
                ((auVar28._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) * 100.0,sVar2,
                sVar2 << 3);
  auVar25._8_4_ = uVar23;
  auVar25._0_8_ = lVar6;
  auVar25._12_4_ = 0x45300000;
  dVar24 = (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0);
  sVar1 = (this->collectionStats).tryMarkCount;
  auVar16._8_4_ = (int)(sVar1 >> 0x20);
  auVar16._0_8_ = sVar1;
  auVar16._12_4_ = 0x45300000;
  sVar3 = (this->collectionStats).tryMarkUnalignedCount;
  auVar17._8_4_ = (int)(sVar3 >> 0x20);
  auVar17._0_8_ = sVar3;
  auVar17._12_4_ = 0x45300000;
  auVar26._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar26._0_8_ = lVar5;
  auVar26._12_4_ = 0x45300000;
  sVar2 = (this->collectionStats).markData.markCount;
  auVar31._8_4_ = (int)(sVar2 >> 0x20);
  auVar31._0_8_ = sVar2;
  auVar31._12_4_ = 0x45300000;
  Output::Print(L"   Non-Mark :%9d %5.1f            | Unaligned : %9d %5.1f | Leaf    :%9d %5.1f\n",
                (dVar24 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) * 100.0,
                (((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / dVar24) * 100.0,
                (((auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                ((auVar31._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) * 100.0);
  sVar2 = (this->collectionStats).markData.markCount;
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).tryMarkCount;
  auVar18._8_4_ = (int)(sVar1 >> 0x20);
  auVar18._0_8_ = sVar1;
  auVar18._12_4_ = 0x45300000;
  sVar3 = (this->collectionStats).tryMarkNonRecyclerMemoryCount;
  auVar19._8_4_ = (int)(sVar3 >> 0x20);
  auVar19._0_8_ = sVar3;
  auVar19._12_4_ = 0x45300000;
  auVar29._8_4_ = uVar23;
  auVar29._0_8_ = lVar6;
  auVar29._12_4_ = 0x45300000;
  Output::Print(L"   Mark     :%9d %5.1f %10d | Non GC    : %9d %5.1f | Track   :%9d\n",
                (((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                ((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) * 100.0,
                (((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) /
                ((auVar29._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0))) * 100.0,sVar2,
                (this->collectionStats).markData.markBytes,sVar3,(this->collectionStats).trackCount)
  ;
  sVar2 = (this->collectionStats).remarkCount;
  auVar10._8_4_ = (int)(sVar2 >> 0x20);
  auVar10._0_8_ = sVar2;
  auVar10._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).tryMarkCount;
  auVar20._8_4_ = (int)(sVar1 >> 0x20);
  auVar20._0_8_ = sVar1;
  auVar20._12_4_ = 0x45300000;
  auVar21._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar21._0_8_ = lVar7;
  auVar21._12_4_ = 0x45300000;
  auVar30._8_4_ = uVar23;
  auVar30._0_8_ = lVar6;
  auVar30._12_4_ = 0x45300000;
  Output::Print(L"   Remark   :%9d %5.1f            | Invalid   : %9d %5.1f \n",
                (((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                ((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) * 100.0,
                (((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                ((auVar30._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0))) * 100.0);
  sVar1 = (this->collectionStats).tryMarkInteriorCount;
  sVar2 = (this->collectionStats).tryMarkInteriorNullCount;
  auVar11._8_4_ = (int)(sVar2 >> 0x20);
  auVar11._0_8_ = sVar2;
  auVar11._12_4_ = 0x45300000;
  auVar27._8_4_ = uVar23;
  auVar27._0_8_ = lVar6;
  auVar27._12_4_ = 0x45300000;
  Output::Print(L" TryMark Int:%9d       %10d | Null Int  : %9d %5.1f | Root    :%9d | New     :%9d\n"
                ,(((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                 ((auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0))) * 100.0,sVar1,
                sVar1 << 3,sVar2,(this->collectionStats).rootCount,
                (this->collectionStats).markThruNewObjCount);
  sVar1 = (this->collectionStats).tryMarkInteriorNonRecyclerMemoryCount;
  auVar12._8_4_ = (int)(sVar1 >> 0x20);
  auVar12._0_8_ = sVar1;
  auVar12._12_4_ = 0x45300000;
  auVar22._8_4_ = uVar23;
  auVar22._0_8_ = lVar6;
  auVar22._12_4_ = 0x45300000;
  Output::Print(L"                                        | Non GC Int: %9d %5.1f | Stack   :%9d | NewFalse:%9d\n"
                ,(((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                 ((auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0))) * 100.0,sVar1,
                (this->collectionStats).stackCount,(this->collectionStats).markThruFalseNewObjCount)
  ;
  return;
}

Assistant:

void
Recycler::PrintMarkCollectionStats()
{
    size_t nonMark = collectionStats.tryMarkCount + collectionStats.tryMarkInteriorCount - collectionStats.remarkCount - collectionStats.markData.markCount;
    size_t invalidCount = nonMark - collectionStats.tryMarkNullCount - collectionStats.tryMarkUnalignedCount
        - collectionStats.tryMarkNonRecyclerMemoryCount
        - collectionStats.tryMarkInteriorNonRecyclerMemoryCount
        - collectionStats.tryMarkInteriorNullCount;
    size_t leafCount = collectionStats.markData.markCount - collectionStats.scanCount;
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("Try Mark    :%9s %5s %10s | Non-Mark  : %9s %5s | Mark    :%9s %5s \n"), _u("Count"), _u("%"), _u("Bytes"), _u("Count"), _u("%"), _u("Count"), _u("%"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u(" TryMark    :%9d       %10d | Null      : %9d %5.1f | Scan    :%9d %5.1f\n"),
        collectionStats.tryMarkCount, collectionStats.tryMarkCount * sizeof(void *),
        collectionStats.tryMarkNullCount, (double)collectionStats.tryMarkNullCount / (double)nonMark * 100,
        collectionStats.scanCount, (double)collectionStats.scanCount / (double)collectionStats.markData.markCount * 100);
    Output::Print(_u("   Non-Mark :%9d %5.1f            | Unaligned : %9d %5.1f | Leaf    :%9d %5.1f\n"),
        nonMark, (double)nonMark / (double)collectionStats.tryMarkCount * 100,
        collectionStats.tryMarkUnalignedCount, (double)collectionStats.tryMarkUnalignedCount / (double)nonMark * 100,
        leafCount, (double)leafCount / (double)collectionStats.markData.markCount * 100);
    Output::Print(_u("   Mark     :%9d %5.1f %10d | Non GC    : %9d %5.1f | Track   :%9d\n"),
        collectionStats.markData.markCount, (double)collectionStats.markData.markCount / (double)collectionStats.tryMarkCount * 100, collectionStats.markData.markBytes,
        collectionStats.tryMarkNonRecyclerMemoryCount, (double)collectionStats.tryMarkNonRecyclerMemoryCount / (double)nonMark * 100,
        collectionStats.trackCount);
    Output::Print(_u("   Remark   :%9d %5.1f            | Invalid   : %9d %5.1f \n"),
        collectionStats.remarkCount, (double)collectionStats.remarkCount / (double)collectionStats.tryMarkCount * 100,
        invalidCount, (double)invalidCount / (double)nonMark * 100);
    Output::Print(_u(" TryMark Int:%9d       %10d | Null Int  : %9d %5.1f | Root    :%9d | New     :%9d\n"),
        collectionStats.tryMarkInteriorCount, collectionStats.tryMarkInteriorCount * sizeof(void *),
        collectionStats.tryMarkInteriorNullCount, (double)collectionStats.tryMarkInteriorNullCount / (double)nonMark * 100,
        collectionStats.rootCount, collectionStats.markThruNewObjCount);
    Output::Print(_u("                                        | Non GC Int: %9d %5.1f | Stack   :%9d | NewFalse:%9d\n"),
        collectionStats.tryMarkInteriorNonRecyclerMemoryCount, (double)collectionStats.tryMarkInteriorNonRecyclerMemoryCount / (double)nonMark * 100,
        collectionStats.stackCount, collectionStats.markThruFalseNewObjCount);
}